

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void nni_list_insert_before(nni_list *list,void *item,void *before)

{
  long *plVar1;
  long lVar2;
  nni_list_node *where;
  nni_list_node *node;
  void *before_local;
  void *item_local;
  nni_list *list_local;
  
  plVar1 = (long *)((long)item + list->ll_offset);
  lVar2 = (long)before + list->ll_offset;
  if ((*plVar1 != 0) || (plVar1[1] != 0)) {
    nni_panic("inserting node already on a list or not inited");
  }
  *plVar1 = lVar2;
  plVar1[1] = *(long *)(lVar2 + 8);
  *(long **)(*plVar1 + 8) = plVar1;
  *(long **)plVar1[1] = plVar1;
  return;
}

Assistant:

void
nni_list_insert_before(nni_list *list, void *item, void *before)
{
	nni_list_node *node  = NODE(list, item);
	nni_list_node *where = NODE(list, before);

	if ((node->ln_next != NULL) || (node->ln_prev != NULL)) {
		nni_panic("inserting node already on a list or not inited");
	}
	node->ln_next          = where;
	node->ln_prev          = where->ln_prev;
	node->ln_next->ln_prev = node;
	node->ln_prev->ln_next = node;
}